

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_psk_key_exchange_modes_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  CBS ke_modes;
  
  if (contents != (CBS *)0x0) {
    iVar2 = CBS_get_u8_length_prefixed(contents,&ke_modes);
    if (((iVar2 == 0) || (ke_modes.len == 0)) || (contents->len != 0)) {
      *out_alert = '2';
      bVar1 = false;
    }
    else {
      pvVar3 = OPENSSL_memchr(ke_modes.data,1,ke_modes.len);
      *(uint *)&hs->field_0x6c8 =
           *(uint *)&hs->field_0x6c8 & 0xffffffef | (uint)(pvVar3 != (void *)0x0) << 4;
      bVar1 = true;
    }
    return bVar1;
  }
  return true;
}

Assistant:

static bool ext_psk_key_exchange_modes_parse_clienthello(SSL_HANDSHAKE *hs,
                                                         uint8_t *out_alert,
                                                         CBS *contents) {
  if (contents == NULL) {
    return true;
  }

  CBS ke_modes;
  if (!CBS_get_u8_length_prefixed(contents, &ke_modes) ||  //
      CBS_len(&ke_modes) == 0 ||                           //
      CBS_len(contents) != 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // We only support tickets with PSK_DHE_KE.
  hs->accept_psk_mode = OPENSSL_memchr(CBS_data(&ke_modes), SSL_PSK_DHE_KE,
                                       CBS_len(&ke_modes)) != NULL;

  return true;
}